

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O2

RangeValue __thiscall CoreML::RangeValue::operator/(RangeValue *this,size_t other)

{
  ostream *out;
  runtime_error *this_00;
  undefined8 in_RCX;
  ulong uVar1;
  RangeValue RVar2;
  RangeValue local_1d0;
  string local_1c0 [32];
  stringstream ss;
  ostream local_190 [376];
  
  RangeValue(&local_1d0);
  if (this->_isUnbound == true) {
    uVar1 = CONCAT71((int7)((ulong)in_RCX >> 8),local_1d0._isUnbound);
  }
  else {
    if (other == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      out = std::operator<<(local_190,"Dividing range ");
      ::operator<<(out,this);
      std::operator<<(out," by 0.");
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,local_1c0);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar1 = 0;
    local_1d0._val = this->_val / other;
  }
  RVar2._0_8_ = uVar1 & 0xffffffff;
  RVar2._val = local_1d0._val;
  return RVar2;
}

Assistant:

RangeValue RangeValue::operator/ (size_t other) const {
    RangeValue retval;
    if (!_isUnbound) {
        if (other == 0) {
            std::stringstream ss;
            ss << "Dividing range " << *this << " by 0.";
            throw std::runtime_error(ss.str());
        }
        retval.set(_val / other);
    }
    return retval;
}